

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces_tests.cpp
# Opt level: O0

void interfaces_tests::findFirstBlockWithTimeAndHeight_invoker(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_wrap_stringstream<char> *msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  long in_FS_OFFSET;
  findFirstBlockWithTimeAndHeight t;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff178;
  std_string *in_stack_fffffffffffff180;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff188;
  findFirstBlockWithTimeAndHeight *in_stack_fffffffffffff198;
  const_string *in_stack_fffffffffffff1a0;
  size_t in_stack_fffffffffffff1a8;
  undefined1 *__s;
  const_string *in_stack_fffffffffffff1b0;
  const_string *file;
  unit_test_log_t *in_stack_fffffffffffff1b8;
  findFirstBlockWithTimeAndHeight *in_stack_fffffffffffff2a8;
  undefined1 local_cb0 [408];
  undefined1 local_b18 [408];
  undefined1 local_980 [408];
  undefined1 local_7e8 [1608];
  undefined1 local_1a0 [408];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff188,
             (pointer)in_stack_fffffffffffff180,(unsigned_long)in_stack_fffffffffffff178);
  memset(local_1a0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff178);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff178);
  boost::operator<<(in_stack_fffffffffffff188,(char *)in_stack_fffffffffffff180);
  boost::operator<<(in_stack_fffffffffffff188,(char (*) [32])in_stack_fffffffffffff180);
  boost::operator<<(in_stack_fffffffffffff188,(char (*) [15])in_stack_fffffffffffff180);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff188);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff188,in_stack_fffffffffffff180);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0,in_stack_fffffffffffff1a8,
             in_stack_fffffffffffff1a0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff178);
  findFirstBlockWithTimeAndHeight::findFirstBlockWithTimeAndHeight(in_stack_fffffffffffff198);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff188,
             (pointer)in_stack_fffffffffffff180,(unsigned_long)in_stack_fffffffffffff178);
  memset(local_7e8,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff178);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff178);
  boost::operator<<(in_stack_fffffffffffff188,(char *)in_stack_fffffffffffff180);
  boost::operator<<(in_stack_fffffffffffff188,(char (*) [32])in_stack_fffffffffffff180);
  boost::operator<<(in_stack_fffffffffffff188,(char (*) [16])in_stack_fffffffffffff180);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff188);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff188,in_stack_fffffffffffff180);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0,in_stack_fffffffffffff1a8,
             in_stack_fffffffffffff1a0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff178);
  boost::unit_test::setup_conditional<interfaces_tests::findFirstBlockWithTimeAndHeight>
            ((findFirstBlockWithTimeAndHeight *)0x6c0140);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff188,
             (pointer)in_stack_fffffffffffff180,(unsigned_long)in_stack_fffffffffffff178);
  memset(local_980,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff178);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff178);
  boost::operator<<(in_stack_fffffffffffff188,(char *)in_stack_fffffffffffff180);
  boost::operator<<(in_stack_fffffffffffff188,(char (*) [32])in_stack_fffffffffffff180);
  boost::operator<<(in_stack_fffffffffffff188,(char (*) [13])in_stack_fffffffffffff180);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff188);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff188,in_stack_fffffffffffff180);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0,in_stack_fffffffffffff1a8,
             in_stack_fffffffffffff1a0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff178);
  findFirstBlockWithTimeAndHeight::test_method(in_stack_fffffffffffff2a8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff188,
             (pointer)in_stack_fffffffffffff180,(unsigned_long)in_stack_fffffffffffff178);
  memset(local_b18,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff178);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff178);
  boost::operator<<(in_stack_fffffffffffff188,(char *)in_stack_fffffffffffff180);
  boost::operator<<(in_stack_fffffffffffff188,(char (*) [32])in_stack_fffffffffffff180);
  boost::operator<<(in_stack_fffffffffffff188,(char (*) [19])in_stack_fffffffffffff180);
  this = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff188);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff188,in_stack_fffffffffffff180);
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,in_stack_fffffffffffff1b0,in_stack_fffffffffffff1a8,
             in_stack_fffffffffffff1a0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff178);
  boost::unit_test::teardown_conditional<interfaces_tests::findFirstBlockWithTimeAndHeight>
            ((findFirstBlockWithTimeAndHeight *)0x6c036c);
  file = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff188,
             (pointer)in_stack_fffffffffffff180,(unsigned_long)in_stack_fffffffffffff178);
  __s = local_cb0;
  memset(__s,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff178);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff178);
  msg = boost::operator<<(in_stack_fffffffffffff188,(char *)in_stack_fffffffffffff180);
  boost::operator<<(in_stack_fffffffffffff188,(char (*) [32])in_stack_fffffffffffff180);
  boost::operator<<(in_stack_fffffffffffff188,(char (*) [15])in_stack_fffffffffffff180);
  this_00 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff188);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)this_00,in_stack_fffffffffffff180);
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,file,(size_t)__s,(const_string *)msg);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff178);
  findFirstBlockWithTimeAndHeight::~findFirstBlockWithTimeAndHeight
            ((findFirstBlockWithTimeAndHeight *)in_stack_fffffffffffff178);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(findFirstBlockWithTimeAndHeight)
{
    LOCK(Assert(m_node.chainman)->GetMutex());
    auto& chain = m_node.chain;
    const CChain& active = Assert(m_node.chainman)->ActiveChain();
    uint256 hash;
    int height;
    BOOST_CHECK(chain->findFirstBlockWithTimeAndHeight(/* min_time= */ 0, /* min_height= */ 5, FoundBlock().hash(hash).height(height)));
    BOOST_CHECK_EQUAL(hash, active[5]->GetBlockHash());
    BOOST_CHECK_EQUAL(height, 5);
    BOOST_CHECK(!chain->findFirstBlockWithTimeAndHeight(/* min_time= */ active.Tip()->GetBlockTimeMax() + 1, /* min_height= */ 0));
}